

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O0

void __thiscall
cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
          (cmGeneratorExpressionDAGChecker *this,string *target,string *property,
          GeneratorExpressionContent *content,cmGeneratorExpressionDAGChecker *parent)

{
  Snapshot snapshot;
  PositionType local_68;
  Snapshot local_58;
  cmGeneratorExpressionDAGChecker *local_30;
  cmGeneratorExpressionDAGChecker *parent_local;
  GeneratorExpressionContent *content_local;
  string *property_local;
  string *target_local;
  cmGeneratorExpressionDAGChecker *this_local;
  
  this->Parent = parent;
  local_30 = parent;
  parent_local = (cmGeneratorExpressionDAGChecker *)content;
  content_local = (GeneratorExpressionContent *)property;
  property_local = target;
  target_local = (string *)this;
  std::__cxx11::string::string((string *)&this->Target,(string *)target);
  std::__cxx11::string::string((string *)&this->Property,(string *)content_local);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::map(&this->Seen);
  this->Content = (GeneratorExpressionContent *)parent_local;
  cmLinkedTree<cmState::SnapshotDataType>::iterator::iterator(&local_68);
  cmState::Snapshot::Snapshot(&local_58,(cmState *)0x0,local_68);
  snapshot.Position.Tree = local_58.Position.Tree;
  snapshot.State = local_58.State;
  snapshot.Position.Position = local_58.Position.Position;
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace,snapshot);
  this->TransitivePropertiesOnly = false;
  Initialize(this);
  return;
}

Assistant:

cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker(
                const std::string &target,
                const std::string &property,
                const GeneratorExpressionContent *content,
                cmGeneratorExpressionDAGChecker *parent)
  : Parent(parent), Target(target), Property(property),
    Content(content), Backtrace(), TransitivePropertiesOnly(false)
{
  Initialize();
}